

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Material::Material(Material *this,Material *other)

{
  Material *other_local;
  Material *this_local;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_00dfdf08;
  std::__cxx11::string::string((string *)&this->mName,(string *)&other->mName);
  aiColor3D::aiColor3D(&this->mDiffuse,&other->mDiffuse);
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = other->mShininessStrength;
  aiColor3D::aiColor3D(&this->mSpecular,&other->mSpecular);
  aiColor3D::aiColor3D(&this->mAmbient,&other->mAmbient);
  this->mShading = other->mShading;
  this->mTransparency = other->mTransparency;
  D3DS::Texture::Texture(&this->sTexDiffuse,&other->sTexDiffuse);
  D3DS::Texture::Texture(&this->sTexOpacity,&other->sTexOpacity);
  D3DS::Texture::Texture(&this->sTexSpecular,&other->sTexSpecular);
  D3DS::Texture::Texture(&this->sTexReflective,&other->sTexReflective);
  D3DS::Texture::Texture(&this->sTexBump,&other->sTexBump);
  D3DS::Texture::Texture(&this->sTexEmissive,&other->sTexEmissive);
  D3DS::Texture::Texture(&this->sTexShininess,&other->sTexShininess);
  this->mBumpHeight = other->mBumpHeight;
  aiColor3D::aiColor3D(&this->mEmissive,&other->mEmissive);
  D3DS::Texture::Texture(&this->sTexAmbient,&other->sTexAmbient);
  this->mTwoSided = (bool)(other->mTwoSided & 1);
  return;
}

Assistant:

Material(Material &&other) AI_NO_EXCEPT
    : mName(std::move(other.mName))
    , mDiffuse(std::move(other.mDiffuse))
    , mSpecularExponent(std::move(other.mSpecularExponent))
    , mShininessStrength(std::move(other.mShininessStrength))
    , mSpecular(std::move(other.mSpecular))
    , mAmbient(std::move(other.mAmbient))
    , mShading(std::move(other.mShading))
    , mTransparency(std::move(other.mTransparency))
    , sTexDiffuse(std::move(other.sTexDiffuse))
    , sTexOpacity(std::move(other.sTexOpacity))
    , sTexSpecular(std::move(other.sTexSpecular))
    , sTexReflective(std::move(other.sTexReflective))
    , sTexBump(std::move(other.sTexBump))
    , sTexEmissive(std::move(other.sTexEmissive))
    , sTexShininess(std::move(other.sTexShininess))
    , mBumpHeight(std::move(other.mBumpHeight))
    , mEmissive(std::move(other.mEmissive))
    , sTexAmbient(std::move(other.sTexAmbient))
    , mTwoSided(std::move(other.mTwoSided))
    {
    }